

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Abc_FrameMiniAigSetCoRequireds(Abc_Frame_t *pAbc,int *pRequireds)

{
  int nSize;
  Gia_Man_t *p;
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGia;
  int *pRequireds_local;
  Abc_Frame_t *pAbc_local;
  
  if (pRequireds == (int *)0x0) {
    printf("Required times are not given.\n");
  }
  else if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start().\n");
  }
  else {
    p = Abc_FrameReadGia(pAbc);
    if (p == (Gia_Man_t *)0x0) {
      printf("Current network in ABC framework is not defined.\n");
    }
    else {
      Vec_IntFreeP(&p->vCoReqs);
      nSize = Gia_ManCoNum(p);
      pVVar1 = Vec_IntAllocArrayCopy(pRequireds,nSize);
      p->vCoReqs = pVVar1;
    }
  }
  return;
}

Assistant:

void Abc_FrameMiniAigSetCoRequireds( Abc_Frame_t * pAbc, int * pRequireds )
{
    Gia_Man_t * pGia;
    if ( pRequireds == NULL )
        { printf( "Required times are not given.\n" ); return; }
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start().\n" ); return; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return; }
    Vec_IntFreeP( &pGia->vCoReqs );
    pGia->vCoReqs = Vec_IntAllocArrayCopy( pRequireds, Gia_ManCoNum(pGia) );
}